

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_cast.cpp
# Opt level: O2

string_t duckdb::StringFromTimestamp<true>(timestamp_t input,Vector *vector)

{
  int32_t val;
  undefined **ppuVar1;
  idx_t iVar2;
  idx_t length;
  unsigned_long uVar3;
  idx_t extraout_RDX;
  idx_t extraout_RDX_00;
  idx_t len;
  char *data;
  size_t __n;
  anon_union_16_2_67f50693_for_value aVar4;
  bool add_bc;
  char nano_buffer [6];
  char micro_buffer [6];
  int32_t date [3];
  int32_t time [4];
  idx_t year_length;
  int32_t picos;
  date_t date_entry;
  dtime_t time_entry;
  anon_union_16_2_67f50693_for_value local_38;
  
  if (input.value == -0x7fffffffffffffff) {
    ppuVar1 = &Date::NINF;
  }
  else {
    if (input.value != 0x7fffffffffffffff) {
      picos = 0;
      Timestamp::Convert((timestamp_ns_t)input.value,&date_entry,&time_entry,&picos);
      picos = picos * 1000;
      Date::Convert(date_entry,date,date + 1,date + 2);
      Time::Convert(time_entry,time,time + 1,time + 2,time + 3);
      micro_buffer[4] = '\0';
      micro_buffer[5] = '\0';
      micro_buffer[0] = '\0';
      micro_buffer[1] = '\0';
      micro_buffer[2] = '\0';
      micro_buffer[3] = '\0';
      nano_buffer[4] = '\0';
      nano_buffer[5] = '\0';
      nano_buffer[0] = '\0';
      nano_buffer[1] = '\0';
      nano_buffer[2] = '\0';
      nano_buffer[3] = '\0';
      iVar2 = DateToStringCast::YearLength(date,&year_length,&add_bc);
      length = TimeToStringCast::MicrosLength(time[3],micro_buffer);
      if (picos == 0) {
        __n = 0;
        len = extraout_RDX;
      }
      else {
        val = TimeToStringCast::FormatMicros(picos,nano_buffer);
        uVar3 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
        __n = 6 - uVar3;
        length = 0xf;
        len = extraout_RDX_00;
      }
      local_38.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)
           StringVector::EmptyString
                     ((StringVector *)vector,(Vector *)(length + iVar2 + __n + 1),len);
      data = local_38._8_8_;
      if (local_38._0_4_ < 0xd) {
        data = local_38.pointer.prefix;
      }
      DateToStringCast::Format(data,date,year_length,add_bc);
      data[iVar2] = ' ';
      TimeToStringCast::Format(data + iVar2 + 1,length,time,micro_buffer);
      switchD_00917c1c::default(data + length + iVar2 + 1,nano_buffer,__n);
      string_t::Finalize((string_t *)&local_38.pointer);
      return (string_t)local_38;
    }
    ppuVar1 = (undefined **)&Date::PINF;
  }
  aVar4.pointer = (anon_struct_16_3_d7536bce_for_pointer)StringVector::AddString(vector,*ppuVar1);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar4.pointer;
}

Assistant:

duckdb::string_t StringFromTimestamp(timestamp_t input, Vector &vector) {
	if (input == timestamp_t::infinity()) {
		return StringVector::AddString(vector, Date::PINF);
	}
	if (input == timestamp_t::ninfinity()) {
		return StringVector::AddString(vector, Date::NINF);
	}

	date_t date_entry;
	dtime_t time_entry;
	int32_t picos = 0;
	if (HAS_NANOS) {
		timestamp_ns_t ns;
		ns.value = input.value;
		Timestamp::Convert(ns, date_entry, time_entry, picos);
		// Use picoseconds so we have 6 digits
		picos *= 1000;
	} else {
		Timestamp::Convert(input, date_entry, time_entry);
	}

	int32_t date[3], time[4];
	Date::Convert(date_entry, date[0], date[1], date[2]);
	Time::Convert(time_entry, time[0], time[1], time[2], time[3]);

	// format for timestamp is DATE TIME (separated by space)
	idx_t year_length;
	bool add_bc;
	char micro_buffer[6] = {};
	char nano_buffer[6] = {};
	idx_t date_length = DateToStringCast::Length(date, year_length, add_bc);
	idx_t time_length = TimeToStringCast::Length(time, micro_buffer);
	idx_t nano_length = 0;
	if (picos) {
		//	If there are ps, we need all the µs
		time_length = 15;
		nano_length = 6;
		nano_length -= NumericCast<idx_t>(TimeToStringCast::FormatMicros(picos, nano_buffer));
	}
	const idx_t length = date_length + 1 + time_length + nano_length;

	string_t result = StringVector::EmptyString(vector, length);
	auto data = result.GetDataWriteable();

	DateToStringCast::Format(data, date, year_length, add_bc);
	data += date_length;
	*data++ = ' ';
	TimeToStringCast::Format(data, time_length, time, micro_buffer);
	data += time_length;
	memcpy(data, nano_buffer, nano_length);
	D_ASSERT(data + nano_length <= result.GetDataWriteable() + length);

	result.Finalize();
	return result;
}